

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles31::Functional::createTextureBufferTests(Context *context)

{
  RenderBits RVar1;
  ModifyBits MVar2;
  _Alloc_hider _Var3;
  TestCaseGroup *this;
  TestCaseGroup *pTVar4;
  LimitQueryCase *pLVar5;
  AlignmentQueryCase *pAVar6;
  TextureBufferBindingQueryCase *pTVar7;
  TextureBindingBufferQueryCase *pTVar8;
  TextureBufferDataStoreQueryCase *pTVar9;
  TextureBufferOffsetQueryCase *pTVar10;
  TextureBufferSizeQueryCase *pTVar11;
  TestCaseGroup *pTVar12;
  TextureBufferCase *pTVar13;
  long lVar14;
  RenderBits renderBits;
  RenderBits renderBits_00;
  ModifyBits modifyBits;
  ModifyBits modifyBits_00;
  ModifyBits modifyBits_01;
  ModifyBits modifyBits_02;
  RenderBits renderBits_01;
  RenderBits renderBits_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar15;
  undefined8 extraout_RDX_02;
  int sizeNdx;
  long lVar16;
  QueryType in_R8D;
  int in_R9D;
  int sizeNdx_1;
  QueryType in_stack_fffffffffffffec8;
  string name;
  size_t offset;
  string local_f0;
  size_t size;
  TestCaseGroup *local_b0;
  size_t local_a8 [6];
  RenderBits local_78 [18];
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,context,"texture_buffer","Texture buffer syncronization tests");
  local_a8[0] = 0x200;
  local_a8[1] = 0x201;
  local_a8[2] = 0x10000;
  local_a8[3] = 0x10001;
  local_a8[4] = 0x1ffff;
  local_78[0] = RENDERBITS_AS_VERTEX_ARRAY;
  local_78[1] = RENDERBITS_AS_INDEX_ARRAY;
  local_78[2] = RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[3] = RENDERBITS_AS_VERTEX_TEXTURE;
  local_78[4] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[5] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[6] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[7] = RENDERBITS_AS_FRAGMENT_TEXTURE;
  local_78[8] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[9] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[10] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY
  ;
  local_78[0xb] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE;
  local_78[0xc] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[0xd] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[0xe] = 0xf;
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,context,"state_query","Query states and limits");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  pLVar5 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar5,context,"max_texture_buffer_size_getboolean",(char *)0x0,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  pLVar5 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar5,context,"max_texture_buffer_size_getinteger",(char *)0x3,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  pLVar5 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar5,context,"max_texture_buffer_size_getinteger64",(char *)0x4,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  pLVar5 = (LimitQueryCase *)operator_new(0x88);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar5,context,"max_texture_buffer_size_getfloat",(char *)0x5,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pLVar5);
  pAVar6 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar6,context,"texture_buffer_offset_alignment_getboolean",(char *)0x0,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pAVar6);
  pAVar6 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar6,context,"texture_buffer_offset_alignment_getinteger",(char *)0x3,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pAVar6);
  pAVar6 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar6,context,"texture_buffer_offset_alignment_getinteger64",(char *)0x4,in_R8D,in_R9D
             ,in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pAVar6);
  pAVar6 = (AlignmentQueryCase *)operator_new(0x88);
  anon_unknown_1::AlignmentQueryCase::AlignmentQueryCase
            (pAVar6,context,"texture_buffer_offset_alignment_getfloat",(char *)0x5,in_R8D,in_R9D,
             in_stack_fffffffffffffec8);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pAVar6);
  pTVar7 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar7,context,"texture_buffer_binding_getboolean",(char *)0x0,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  pTVar7 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar7,context,"texture_buffer_binding_getinteger",(char *)0x3,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  pTVar7 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar7,context,"texture_buffer_binding_getinteger64",(char *)0x4,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  pTVar7 = (TextureBufferBindingQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferBindingQueryCase::TextureBufferBindingQueryCase
            (pTVar7,context,"texture_buffer_binding_getfloat",(char *)0x5,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar7);
  pTVar8 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar8,context,"texture_binding_buffer_getboolean",(char *)0x0,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar8);
  pTVar8 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar8,context,"texture_binding_buffer_getinteger",(char *)0x3,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar8);
  pTVar8 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar8,context,"texture_binding_buffer_getinteger64",(char *)0x4,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar8);
  pTVar8 = (TextureBindingBufferQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBindingBufferQueryCase::TextureBindingBufferQueryCase
            (pTVar8,context,"texture_binding_buffer_getfloat",(char *)0x5,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar8);
  pTVar9 = (TextureBufferDataStoreQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferDataStoreQueryCase::TextureBufferDataStoreQueryCase
            (pTVar9,context,"texture_buffer_data_store_binding_integer",(char *)0x1d,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar9);
  pTVar9 = (TextureBufferDataStoreQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferDataStoreQueryCase::TextureBufferDataStoreQueryCase
            (pTVar9,context,"texture_buffer_data_store_binding_float",(char *)0x1e,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar9);
  pTVar10 = (TextureBufferOffsetQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferOffsetQueryCase::TextureBufferOffsetQueryCase
            (pTVar10,context,"texture_buffer_offset_integer",(char *)0x1d,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar10);
  pTVar10 = (TextureBufferOffsetQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferOffsetQueryCase::TextureBufferOffsetQueryCase
            (pTVar10,context,"texture_buffer_offset_float",(char *)0x1e,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar10);
  pTVar11 = (TextureBufferSizeQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferSizeQueryCase::TextureBufferSizeQueryCase
            (pTVar11,context,"texture_buffer_size_integer",(char *)0x1d,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar11);
  pTVar11 = (TextureBufferSizeQueryCase *)operator_new(0x80);
  anon_unknown_1::TextureBufferSizeQueryCase::TextureBufferSizeQueryCase
            (pTVar11,context,"texture_buffer_size_float",(char *)0x1e,in_R8D);
  tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar11);
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,context,"render",
             "Setup texture buffer with glBufferData and render data in different ways");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (lVar14 = 0; lVar14 != 0xf; lVar14 = lVar14 + 1) {
    RVar1 = local_78[lVar14];
    pTVar12 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits);
    _Var3 = name._M_dataplus;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_00);
    TestCaseGroup::TestCaseGroup(pTVar12,context,_Var3._M_p,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar12);
    for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
      size = local_a8[lVar16];
      de::toString<unsigned_long>(&local_f0,&size);
      std::operator+(&name,"buffer_size_",&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,size,0,0,RENDERBITS_NONE,
                 MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
    for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 8) {
      size = *(size_t *)((long)&DAT_00852500 + lVar16);
      de::toString<unsigned_long>(&local_f0,&size);
      std::operator+(&name,"range_size_",&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,size,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 8) {
      offset = *(size_t *)((long)&DAT_00851e80 + lVar16);
      de::toString<unsigned_long>((string *)&size,&offset);
      std::operator+(&local_f0,"offset_",(string *)&size);
      std::operator+(&name,&local_f0,"_alignments");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&size);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,offset,0x10001,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,context,"modify","Modify texture buffer content in multiple ways");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    MVar2 = (&DAT_00851e90)[lVar14];
    pTVar12 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits);
    _Var3 = name._M_dataplus;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_00);
    TestCaseGroup::TestCaseGroup(pTVar12,context,_Var3._M_p,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar12);
    for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
      size = local_a8[lVar16];
      de::toString<unsigned_long>(&local_f0,&size);
      std::operator+(&name,"buffer_size_",&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,size,0,0,RENDERBITS_NONE,
                 MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
    for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 8) {
      size = *(size_t *)((long)&DAT_00852500 + lVar16);
      de::toString<unsigned_long>(&local_f0,&size);
      std::operator+(&name,"range_size_",&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,size,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 8) {
      offset = *(size_t *)((long)&DAT_00851e80 + lVar16);
      de::toString<unsigned_long>((string *)&size,&offset);
      std::operator+(&local_f0,"offset_",(string *)&size);
      std::operator+(&name,&local_f0,"_alignments");
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&size);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,offset,0x10001,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,context,"modify_render",
             "Modify texture buffer content in multiple ways and render in different ways");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_b0 = pTVar4;
  for (lVar14 = 0; pTVar4 = local_b0, lVar14 != 4; lVar14 = lVar14 + 1) {
    MVar2 = (&DAT_00851e90)[lVar14];
    pTVar12 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_01);
    _Var3 = name._M_dataplus;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_02);
    TestCaseGroup::TestCaseGroup(pTVar12,context,_Var3._M_p,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar12);
    uVar15 = extraout_RDX;
    for (lVar16 = 0; lVar16 != 0xf; lVar16 = lVar16 + 1) {
      RVar1 = local_78[lVar16];
      (anonymous_namespace)::toTestName_abi_cxx11_
                (&name,(_anonymous_namespace_ *)(ulong)RVar1,(RenderBits)uVar15);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RENDERBITS_NONE,
                 MVar2,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
      uVar15 = extraout_RDX_00;
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar4,context,"render_modify","Render texture buffer and modify.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  local_b0 = pTVar4;
  for (lVar14 = 0; pTVar4 = local_b0, lVar14 != 0xf; lVar14 = lVar14 + 1) {
    RVar1 = local_78[lVar14];
    pTVar12 = (TestCaseGroup *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_01);
    _Var3 = name._M_dataplus;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_02);
    TestCaseGroup::TestCaseGroup(pTVar12,context,_Var3._M_p,local_f0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name);
    tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pTVar12);
    uVar15 = extraout_RDX_01;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 4) {
      MVar2 = *(ModifyBits *)((long)&DAT_00851e90 + lVar16);
      (anonymous_namespace)::toTestName_abi_cxx11_
                (&name,(_anonymous_namespace_ *)(ulong)MVar2,(ModifyBits)uVar15);
      pTVar13 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar13,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RVar1,MVar2,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild((TestNode *)pTVar12,(TestNode *)pTVar13);
      std::__cxx11::string::~string((string *)&name);
      uVar15 = extraout_RDX_02;
    }
  }
  return this;
}

Assistant:

TestCaseGroup* createTextureBufferTests (Context& context)
{
	TestCaseGroup* const root = new TestCaseGroup(context, "texture_buffer", "Texture buffer syncronization tests");

	const size_t bufferSizes[] =
	{
		512,
		513,
		65536,
		65537,
		131071
	};

	const size_t rangeSizes[] =
	{
		512,
		513,
		65537,
		98304,
	};

	const size_t offsets[] =
	{
		1,
		7
	};

	const RenderBits renderTypeCombinations[] =
	{
		RENDERBITS_AS_VERTEX_ARRAY,
									  RENDERBITS_AS_INDEX_ARRAY,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY,

																  RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,

																								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|															  RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
																  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE
	};

	const ModifyBits modifyTypes[] =
	{
		MODIFYBITS_BUFFERDATA,
		MODIFYBITS_BUFFERSUBDATA,
		MODIFYBITS_MAPBUFFER_WRITE,
		MODIFYBITS_MAPBUFFER_READWRITE
	};

	// State and limit queries
	{
		TestCaseGroup* const queryGroup = new TestCaseGroup(context, "state_query", "Query states and limits");
		root->addChild(queryGroup);

		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getboolean",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_BOOLEAN));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger64",			"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER64));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getfloat",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_FLOAT));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getboolean",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_BOOLEAN));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger64",	"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER64));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getfloat",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getboolean",	"TEXTURE_BUFFER_BINDING", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger64",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getfloat",		"TEXTURE_BUFFER_BINDING", QUERY_FLOAT));

		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getboolean",	"TEXTURE_BINDING_BUFFER", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger64",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getfloat",		"TEXTURE_BINDING_BUFFER", QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_integer",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_float",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_integer",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_float",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_integer",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_float",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_FLOAT));
	}

	// Rendering test
	{
		TestCaseGroup* const renderGroup = new TestCaseGroup(context, "render", "Setup texture buffer with glBufferData and render data in different ways");
		root->addChild(renderGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderGroup->addChild(renderTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t size	= bufferSizes[sizeNdx];
				const string name	("buffer_size_" + de::toString(size));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify tests
	{
		TestCaseGroup* const modifyGroup = new TestCaseGroup(context, "modify", "Modify texture buffer content in multiple ways");
		root->addChild(modifyGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyGroup->addChild(modifyTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t	size	= bufferSizes[sizeNdx];
				const string	name	("buffer_size_" + de::toString(size));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify-Render tests
	{
		TestCaseGroup* const modifyRenderGroup = new TestCaseGroup(context, "modify_render", "Modify texture buffer content in multiple ways and render in different ways");
		root->addChild(modifyRenderGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyRenderGroup->addChild(modifyTypeGroup);

			for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
			{
				const RenderBits	renderType	= renderTypeCombinations[renderTypeNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(renderType));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Render-Modify tests
	{
		TestCaseGroup* const renderModifyGroup = new TestCaseGroup(context, "render_modify", "Render texture buffer and modify.");
		root->addChild(renderModifyGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderModifyGroup->addChild(renderTypeGroup);

			for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
			{
				const ModifyBits	modifyType	= modifyTypes[modifyNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(modifyType));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, renderType, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	return root;
}